

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

DistantLight * __thiscall
embree::SceneGraph::DistantLight::transform(DistantLight *this,AffineSpace3fa *space)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  DistantLight *in_RDX;
  long in_RSI;
  DistantLight *in_RDI;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  float *local_2c8;
  undefined1 *local_2b8;
  Vec3fa *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  float local_294;
  undefined8 *local_290;
  float local_284;
  undefined8 *local_280;
  float local_274;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 *local_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1a8;
  undefined1 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined1 *local_188;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  Vec3fa *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  Vec3fa *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_2c8 = (float *)(in_RSI + 0x10);
  local_2b8 = &stack0xfffffffffffffca8;
  local_294 = *local_2c8;
  local_290 = &local_2d8;
  local_158 = CONCAT44(local_294,local_294);
  uStack_150 = CONCAT44(local_294,local_294);
  local_284 = *(float *)(in_RSI + 0x14);
  local_280 = &local_2f8;
  local_98 = CONCAT44(local_284,local_284);
  uStack_90 = CONCAT44(local_284,local_284);
  local_f0 = &in_RDX->D;
  local_274 = *(float *)(in_RSI + 0x18);
  local_270 = &local_318;
  local_258 = CONCAT44(local_274,local_274);
  uStack_250 = CONCAT44(local_274,local_274);
  local_2b0 = &in_RDX->L;
  local_2a0 = &local_308;
  local_2a8 = &local_318;
  uVar1 = *(undefined8 *)&local_2b0->field_0;
  uVar2 = *(undefined8 *)((long)&(in_RDX->L).field_0 + 8);
  local_268._0_4_ = (float)uVar1;
  local_268._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_260._0_4_ = (float)uVar2;
  uStack_260._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_248 = local_274 * (float)local_268;
  fStack_244 = local_274 * local_268._4_4_;
  fStack_240 = local_274 * (float)uStack_260;
  fStack_23c = local_274 * uStack_260._4_4_;
  local_230 = &local_308;
  local_e0 = &local_2e8;
  local_e8 = &local_2f8;
  local_f8 = &local_308;
  local_b0 = &local_108;
  uVar3 = *(undefined8 *)&local_f0->field_0;
  uVar4 = *(undefined8 *)((long)&(in_RDX->D).field_0 + 8);
  local_a8._0_4_ = (float)uVar3;
  local_a8._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_a0._0_4_ = (float)uVar4;
  uStack_a0._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_88 = local_284 * (float)local_a8;
  fStack_84 = local_284 * local_a8._4_4_;
  fStack_80 = local_284 * (float)uStack_a0;
  fStack_7c = local_284 * uStack_a0._4_4_;
  local_70 = &local_108;
  local_38 = CONCAT44(fStack_84,local_88);
  uStack_30 = CONCAT44(fStack_7c,fStack_80);
  local_c8 = &local_2e8;
  local_d0 = &local_108;
  local_48 = (float)local_308;
  fStack_44 = (float)((ulong)local_308 >> 0x20);
  fStack_40 = (float)uStack_300;
  fStack_3c = (float)((ulong)uStack_300 >> 0x20);
  local_68 = local_88 + local_48;
  fStack_64 = fStack_84 + fStack_44;
  fStack_60 = fStack_80 + fStack_40;
  fStack_5c = fStack_7c + fStack_3c;
  local_50 = &local_2e8;
  local_1a0 = &stack0xfffffffffffffca8;
  local_1a8 = &local_2d8;
  local_1b8 = &local_2e8;
  local_170 = &local_1c8;
  uVar5 = *(undefined8 *)in_RDX;
  uVar6 = *(undefined8 *)&in_RDX->field_0x8;
  local_168._0_4_ = (float)uVar5;
  local_168._4_4_ = (float)((ulong)uVar5 >> 0x20);
  uStack_160._0_4_ = (float)uVar6;
  uStack_160._4_4_ = (float)((ulong)uVar6 >> 0x20);
  local_148 = local_294 * (float)local_168;
  fStack_144 = local_294 * local_168._4_4_;
  fStack_140 = local_294 * (float)uStack_160;
  fStack_13c = local_294 * uStack_160._4_4_;
  local_130 = &local_1c8;
  local_18 = CONCAT44(fStack_144,local_148);
  uStack_10 = CONCAT44(fStack_13c,fStack_140);
  local_188 = &stack0xfffffffffffffca8;
  local_190 = &local_1c8;
  local_28 = (float)local_2e8;
  fStack_24 = (float)((ulong)local_2e8 >> 0x20);
  fStack_20 = (float)uStack_2e0;
  fStack_1c = (float)((ulong)uStack_2e0 >> 0x20);
  local_128 = local_148 + local_28;
  fStack_124 = fStack_144 + fStack_24;
  fStack_120 = fStack_140 + fStack_20;
  fStack_11c = fStack_13c + fStack_1c;
  local_110 = &stack0xfffffffffffffca8;
  local_268 = uVar1;
  uStack_260 = uVar2;
  local_228 = local_274;
  fStack_224 = local_274;
  fStack_220 = local_274;
  fStack_21c = local_274;
  local_218 = local_274;
  local_208 = local_284;
  fStack_204 = local_284;
  fStack_200 = local_284;
  fStack_1fc = local_284;
  local_1ec = local_284;
  local_1e8 = local_294;
  fStack_1e4 = local_294;
  fStack_1e0 = local_294;
  fStack_1dc = local_294;
  local_1cc = local_294;
  local_198 = local_1b8;
  local_178 = local_1a8;
  local_168 = uVar5;
  uStack_160 = uVar6;
  local_d8 = local_f8;
  local_c0 = local_f0;
  local_b8 = local_e8;
  local_a8 = uVar3;
  uStack_a0 = uVar4;
  local_318 = local_258;
  uStack_310 = uStack_250;
  local_308 = CONCAT44(fStack_244,local_248);
  uStack_300 = CONCAT44(fStack_23c,fStack_240);
  local_2f8 = local_98;
  uStack_2f0 = uStack_90;
  local_2e8 = CONCAT44(fStack_64,local_68);
  uStack_2e0 = CONCAT44(fStack_5c,fStack_60);
  local_2d8 = local_158;
  uStack_2d0 = uStack_150;
  local_1c8 = local_18;
  uStack_1c0 = uStack_10;
  local_108 = local_38;
  uStack_100 = uStack_30;
  DistantLight(in_RDX,(Vec3fa *)CONCAT44(fStack_11c,fStack_120),
               (Vec3fa *)CONCAT44(fStack_124,local_128),(float)((ulong)in_RDI >> 0x20));
  return in_RDI;
}

Assistant:

DistantLight transform(const AffineSpace3fa& space) const {
        return DistantLight(xfmVector(space,D),L,halfAngle);
      }